

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

ON_UserData * __thiscall
ON_Object::TransferUserDataItem
          (ON_Object *this,ON_UserData *source_ud_copy_this,ON_UserData *source_ud_move_this,
          bool bPerformConflictCheck,UserDataConflictResolution userdata_conflict_resolution)

{
  byte bVar1;
  bool bVar2;
  ON_UserData *pOVar3;
  ON_UserData *pOVar4;
  char *sFormat;
  int line_number;
  bool bVar5;
  
  if (source_ud_move_this == (ON_UserData *)0x0) {
    if (source_ud_copy_this != (ON_UserData *)0x0) {
      pOVar4 = source_ud_copy_this;
      if (source_ud_copy_this->m_userdata_owner != this) goto LAB_0055bac9;
      sFormat = "source_ud_copy_this is already attached to this object.";
      line_number = 0x5cb;
      goto LAB_0055bc5e;
    }
    goto LAB_0055bc3e;
  }
  if (source_ud_copy_this != (ON_UserData *)0x0) {
    sFormat = "At most one source_ud pointer can be not null.";
    line_number = 0x5bd;
    goto LAB_0055bc5e;
  }
  if ((source_ud_move_this->m_userdata_owner != (ON_Object *)0x0) ||
     (pOVar4 = source_ud_move_this, source_ud_move_this->m_userdata_next != (ON_UserData *)0x0)) {
    sFormat = "Cannot move userdata that is attached to another object.";
    line_number = 0x5c2;
    goto LAB_0055bc5e;
  }
LAB_0055bac9:
  bVar2 = ON_UserData::IsUnknownUserData(pOVar4);
  if (bVar2) {
    ON_UnknownUserData::Cast(&pOVar4->super_ON_Object);
  }
  if (bPerformConflictCheck) {
    pOVar3 = GetUserData(this,&pOVar4->m_userdata_uuid);
  }
  else {
    pOVar3 = (ON_UserData *)0x0;
  }
  bVar2 = true;
  if (pOVar3 == (ON_UserData *)0x0) goto switchD_0055bb52_caseD_1;
  switch(userdata_conflict_resolution) {
  case source_object:
    goto switchD_0055bb52_caseD_1;
  case source_copycount_gt:
    bVar2 = pOVar4->m_userdata_copycount < pOVar3->m_userdata_copycount;
    bVar5 = pOVar4->m_userdata_copycount == pOVar3->m_userdata_copycount;
    break;
  case source_copycount_ge:
    bVar2 = pOVar4->m_userdata_copycount < pOVar3->m_userdata_copycount;
    goto LAB_0055bb91;
  case destination_copycount_gt:
    bVar2 = pOVar3->m_userdata_copycount < pOVar4->m_userdata_copycount;
    bVar5 = pOVar3->m_userdata_copycount == pOVar4->m_userdata_copycount;
    break;
  case destination_copycount_ge:
    bVar2 = pOVar3->m_userdata_copycount < pOVar4->m_userdata_copycount;
LAB_0055bb91:
    bVar2 = !bVar2;
    goto switchD_0055bb52_caseD_1;
  case delete_item:
    bVar1 = 1;
    goto LAB_0055bbfd;
  default:
    bVar1 = 0;
LAB_0055bbfd:
    bVar2 = false;
    goto LAB_0055bba3;
  }
  bVar2 = !bVar2 && !bVar5;
switchD_0055bb52_caseD_1:
  bVar1 = 0;
LAB_0055bba3:
  if (bVar2) {
    if (source_ud_copy_this != (ON_UserData *)0x0) {
      pOVar4 = ON_UserData::Duplicate(source_ud_copy_this);
      if (pOVar4 == (ON_UserData *)0x0) {
        bVar2 = false;
      }
      else {
        source_ud_move_this = ON_UserData::Cast(&pOVar4->super_ON_Object);
        if (source_ud_move_this == (ON_UserData *)0x0) {
          (*(pOVar4->super_ON_Object)._vptr_ON_Object[4])(pOVar4);
          bVar2 = false;
          source_ud_move_this = (ON_UserData *)0x0;
        }
        else {
          source_ud_move_this->m_userdata_owner = (ON_Object *)0x0;
          bVar2 = true;
        }
      }
      if (!bVar2) goto LAB_0055bc3e;
    }
    if (source_ud_move_this == (ON_UserData *)0x0) {
      sFormat = "Bug in the code above.";
      line_number = 0x62b;
LAB_0055bc5e:
      source_ud_move_this = (ON_UserData *)0x0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,line_number,"",sFormat);
    }
    else {
      if (pOVar3 != (ON_UserData *)0x0) {
        (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])(pOVar3);
      }
      source_ud_move_this->m_userdata_owner = this;
      source_ud_move_this->m_userdata_next = this->m_userdata_list;
      this->m_userdata_list = source_ud_move_this;
    }
  }
  else {
    if (!(bool)(bVar1 ^ 1) && pOVar3 != (ON_UserData *)0x0) {
      (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])(pOVar3);
    }
LAB_0055bc3e:
    source_ud_move_this = (ON_UserData *)0x0;
  }
  return source_ud_move_this;
}

Assistant:

ON_UserData* ON_Object::TransferUserDataItem(
  const ON_UserData* source_ud_copy_this,
  ON_UserData* source_ud_move_this,
  bool bPerformConflictCheck,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution
  )
{
  const ON_UserData* source_ud; // do not initialize so compiler will detect future bugs

  if (nullptr != source_ud_move_this)
  {
    if (nullptr != source_ud_copy_this)
    {
      ON_ERROR("At most one source_ud pointer can be not null.");
      return nullptr;
    }
    if (nullptr != source_ud_move_this->m_userdata_owner || nullptr != source_ud_move_this->m_userdata_next)
    {
      ON_ERROR("Cannot move userdata that is attached to another object.");
      return nullptr;
    }
    source_ud = source_ud_move_this;
  }
  else if ( nullptr != source_ud_copy_this )
  {
    if (this == source_ud_copy_this->m_userdata_owner)
    {
      ON_ERROR("source_ud_copy_this is already attached to this object.");
      return nullptr;
    }
    source_ud = source_ud_copy_this;
  }
  else
  {
    // nothing to do
    return nullptr;
  }

  if (source_ud->IsUnknownUserData())
  {
    // make sure we have valid user data - the first beta release of Rhino 2.0 
    // created empty user data.
    const ON_UnknownUserData* uud = ON_UnknownUserData::Cast(source_ud);
    if (nullptr == uud && false == uud->IsValid())
    {
      return nullptr;
    }
  }
  
  ON_UserData* dest_ud = bPerformConflictCheck ? GetUserData(source_ud->m_userdata_uuid) : nullptr;

  bool bDeleteDestinationItem = false;
  bool bTransferSourceItem; // no initialization
  if (nullptr == dest_ud)
  {
    bTransferSourceItem = true;
  }
  else
  {
    switch (userdata_conflict_resolution)
    {
    case ON_Object::UserDataConflictResolution::destination_object:
      bTransferSourceItem = false;
      break;

    case ON_Object::UserDataConflictResolution::source_object:
      bTransferSourceItem = true;
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_gt:
      bTransferSourceItem = (source_ud->m_userdata_copycount > dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_ge:
      bTransferSourceItem =  (source_ud->m_userdata_copycount >= dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_gt:
      bTransferSourceItem = (dest_ud->m_userdata_copycount > source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_ge:
      bTransferSourceItem =  (dest_ud->m_userdata_copycount >= source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::delete_item:
      bTransferSourceItem = false;
      bDeleteDestinationItem = true;
      break;

    default:
      bTransferSourceItem = false;
      break;
    }
  }

  if (false == bTransferSourceItem)
  {
    if (bDeleteDestinationItem && nullptr != dest_ud)
    {
      delete dest_ud;
    }
    return nullptr;
  }


  if (nullptr != source_ud_copy_this)
  {
    ON_Object* p = source_ud_copy_this->Duplicate();
    if ( nullptr == p )
      return nullptr;
    source_ud_move_this = ON_UserData::Cast(p);

    if (nullptr == source_ud_move_this)
    {
      delete p;
      return nullptr;
    }
    source_ud_move_this->m_userdata_owner = nullptr;
  }

  if (nullptr == source_ud_move_this)
  {
    ON_ERROR("Bug in the code above.");
    return nullptr;
  }

  if (nullptr != dest_ud)
  {
    delete dest_ud;
  }

  source_ud_move_this->m_userdata_owner = this;
  source_ud_move_this->m_userdata_next = m_userdata_list;
  m_userdata_list = source_ud_move_this;
  
  return m_userdata_list;
}